

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O3

size_t sk_proxy_write_oob(Socket *s,void *data,size_t len)

{
  size_t sVar1;
  
  if (s[-10].vt != (SocketVtable *)0x0) {
    bufchain_clear((bufchain *)(s + -0x1a));
    bufchain_clear((bufchain *)(s + -0x15));
    bufchain_add((bufchain *)(s + -0x15),data,len);
    return len;
  }
  sVar1 = (**(code **)((s[-0x20].vt)->plug + 0x18))(s[-0x20].vt,data,len);
  return sVar1;
}

Assistant:

static size_t sk_proxy_write_oob (Socket *s, const void *data, size_t len)
{
    ProxySocket *ps = container_of(s, ProxySocket, sock);

    if (ps->pn) {
        bufchain_clear(&ps->pending_output_data);
        bufchain_clear(&ps->pending_oob_output_data);
        bufchain_add(&ps->pending_oob_output_data, data, len);
        return len;
    }
    return sk_write_oob(ps->sub_socket, data, len);
}